

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O1

void ssh2_write_pubkey(FILE *fp,char *comment,void *v_pub_blob,int pub_len,int keytype)

{
  char cVar1;
  int n;
  char *ptr;
  int iVar2;
  int iVar3;
  char buf [5];
  char local_3d [4];
  undefined1 local_39;
  void *local_38;
  
  if (keytype == 10) {
    ptr = ssh2_pubkey_openssh_str_internal(comment,v_pub_blob,pub_len);
    fprintf((FILE *)fp,"%s\n",ptr);
    safefree(ptr);
    return;
  }
  if (keytype != 9) {
    __assert_fail("false && \"Bad key type in ssh2_write_pubkey\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                  0x6b6,"void ssh2_write_pubkey(FILE *, const char *, const void *, int, int)");
  }
  fwrite("---- BEGIN SSH2 PUBLIC KEY ----\n",0x20,1,(FILE *)fp);
  if (comment != (char *)0x0) {
    fwrite("Comment: \"",10,1,(FILE *)fp);
    do {
      cVar1 = *comment;
      if ((cVar1 == '\"') || (cVar1 == '\\')) {
        fputc(0x5c,(FILE *)fp);
      }
      else if (cVar1 == '\0') goto LAB_00110fb6;
      fputc((int)*comment,(FILE *)fp);
      comment = comment + 1;
    } while( true );
  }
LAB_00110fcf:
  if (0 < pub_len) {
    iVar2 = 0;
    iVar3 = 0;
    local_38 = v_pub_blob;
    do {
      n = pub_len - iVar2;
      if (2 < pub_len - iVar2) {
        n = 3;
      }
      base64_encode_atom((uchar *)((long)iVar2 + (long)local_38),n,local_3d);
      local_39 = 0;
      fputs(local_3d,(FILE *)fp);
      if (iVar3 < 0xf) {
        iVar3 = iVar3 + 1;
      }
      else {
        fputc(10,(FILE *)fp);
        iVar3 = 0;
      }
      iVar2 = iVar2 + n;
    } while (iVar2 < pub_len);
    if (0 < iVar3) {
      fputc(10,(FILE *)fp);
    }
  }
  fwrite("---- END SSH2 PUBLIC KEY ----\n",0x1e,1,(FILE *)fp);
  return;
LAB_00110fb6:
  fwrite("\"\n",2,1,(FILE *)fp);
  goto LAB_00110fcf;
}

Assistant:

void ssh2_write_pubkey(FILE *fp, const char *comment,
                       const void *v_pub_blob, int pub_len,
                       int keytype)
{
    unsigned char *pub_blob = (unsigned char *)v_pub_blob;

    if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716) {
        const char *p;
        int i, column;

        fprintf(fp, "---- BEGIN SSH2 PUBLIC KEY ----\n");

        if (comment) {
            fprintf(fp, "Comment: \"");
            for (p = comment; *p; p++) {
                if (*p == '\\' || *p == '\"')
                    fputc('\\', fp);
                fputc(*p, fp);
            }
            fprintf(fp, "\"\n");
        }

        i = 0;
        column = 0;
        while (i < pub_len) {
            char buf[5];
            int n = (pub_len - i < 3 ? pub_len - i : 3);
            base64_encode_atom(pub_blob + i, n, buf);
            i += n;
            buf[4] = '\0';
            fputs(buf, fp);
            if (++column >= 16) {
                fputc('\n', fp);
                column = 0;
            }
        }
        if (column > 0)
            fputc('\n', fp);

        fprintf(fp, "---- END SSH2 PUBLIC KEY ----\n");
    } else if (keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
        char *buffer = ssh2_pubkey_openssh_str_internal(comment,
                                                        v_pub_blob, pub_len);
        fprintf(fp, "%s\n", buffer);
        sfree(buffer);
    } else {
        unreachable("Bad key type in ssh2_write_pubkey");
    }
}